

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmalloc.c
# Opt level: O3

void * hrealloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  pvVar1 = realloc(ptr,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  if (mem_panic == 0) {
    mem_panic = 1;
  }
  exit(1);
}

Assistant:

void *hrealloc(void *ptr, size_t size) {
    void *p;

    if (!(p = realloc(ptr, size))) {
        if (mem_panic) exit(1);
        mem_panic = 1;
        exit(1);
    }

    return p;
}